

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O0

FileOptions *
google::protobuf::compiler::StripLocalSourceRetentionOptions
          (FileOptions *__return_storage_ptr__,FileDescriptor *descriptor)

{
  FileDescriptor *descriptor_local;
  
  anon_unknown_0::StripLocalOptions<google::protobuf::FileDescriptor>
            (__return_storage_ptr__,descriptor);
  return __return_storage_ptr__;
}

Assistant:

FileOptions StripLocalSourceRetentionOptions(const FileDescriptor& descriptor) {
  return StripLocalOptions(descriptor);
}